

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateOperandForDebugInfo
          (ValidationState_t *_,string *operand_name,Op expected_opcode,Instruction *inst,
          uint32_t word_index,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *ext_inst_name)

{
  uint32_t id;
  Op OVar1;
  spv_result_t sVar2;
  AssemblyGrammar *this;
  DiagnosticStream *pDVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  DiagnosticStream local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  DiagnosticStream local_228;
  spv_opcode_desc local_50;
  spv_opcode_desc desc;
  Instruction *operand;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *ext_inst_name_local;
  Instruction *pIStack_30;
  uint32_t word_index_local;
  Instruction *inst_local;
  string *psStack_20;
  Op expected_opcode_local;
  string *operand_name_local;
  ValidationState_t *__local;
  
  operand = (Instruction *)ext_inst_name;
  ext_inst_name_local._4_4_ = word_index;
  pIStack_30 = inst;
  inst_local._4_4_ = expected_opcode;
  psStack_20 = operand_name;
  operand_name_local = (string *)_;
  id = Instruction::word(inst,(ulong)word_index);
  desc = (spv_opcode_desc)ValidationState_t::FindDef(_,id);
  OVar1 = Instruction::opcode((Instruction *)desc);
  if (OVar1 == inst_local._4_4_) {
    __local._4_4_ = SPV_SUCCESS;
  }
  else {
    local_50 = (spv_opcode_desc)0x0;
    this = ValidationState_t::grammar((ValidationState_t *)operand_name_local);
    sVar2 = AssemblyGrammar::lookupOpcode(this,inst_local._4_4_,&local_50);
    if ((sVar2 == SPV_SUCCESS) && (local_50 != (spv_opcode_desc)0x0)) {
      ValidationState_t::diag
                (&local_420,(ValidationState_t *)operand_name_local,SPV_ERROR_INVALID_DATA,
                 pIStack_30);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
      operator()(&local_440,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                  *)operand);
      pDVar3 = DiagnosticStream::operator<<(&local_420,&local_440);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [3])0x68bfe4);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [18])0x63b174);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,psStack_20);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [25])0x63aa56);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [3])0x63ddc7);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_50->name);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&local_440);
      DiagnosticStream::~DiagnosticStream(&local_420);
    }
    else {
      ValidationState_t::diag
                (&local_228,(ValidationState_t *)operand_name_local,SPV_ERROR_INVALID_DATA,
                 pIStack_30);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
      operator()(&local_248,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                  *)operand);
      pDVar3 = DiagnosticStream::operator<<(&local_228,&local_248);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [3])0x68bfe4);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [18])0x63b174);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,psStack_20);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [12])" is invalid");
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&local_248);
      DiagnosticStream::~DiagnosticStream(&local_228);
    }
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateOperandForDebugInfo(
    ValidationState_t& _, const std::string& operand_name,
    spv::Op expected_opcode, const Instruction* inst, uint32_t word_index,
    const std::function<std::string()>& ext_inst_name) {
  auto* operand = _.FindDef(inst->word(word_index));
  if (operand->opcode() != expected_opcode) {
    spv_opcode_desc desc = nullptr;
    if (_.grammar().lookupOpcode(expected_opcode, &desc) != SPV_SUCCESS ||
        !desc) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << ext_inst_name() << ": "
             << "expected operand " << operand_name << " is invalid";
    }
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << ext_inst_name() << ": "
           << "expected operand " << operand_name << " must be a result id of "
           << "Op" << desc->name;
  }
  return SPV_SUCCESS;
}